

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

void PreProcess(Mat *frame,Net *net,Size *inpSize)

{
  ostream *poVar1;
  allocator local_d9;
  _OutputArray local_d8;
  Scalar_<double> local_c0;
  Scalar_<double> local_a0;
  Mat blob;
  
  if ((inpSize->width < 1) || (inpSize->height < 1)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Incorrect input dimensions.  Exiting...");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    cv::Mat::Mat(&blob);
    local_c0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
    local_d8.super__InputArray.sz.width = 0;
    local_d8.super__InputArray.sz.height = 0;
    local_c0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = 0x1010000;
    local_d8.super__InputArray.flags = 0x2010000;
    local_d8.super__InputArray.obj = &blob;
    local_c0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)frame;
    cv::Scalar_<double>::Scalar_(&local_a0);
    cv::dnn::dnn4_v20211004::blobFromImage
              ((_InputArray *)&local_c0,&local_d8,0.00392156862745098,(Size_ *)inpSize,
               (Scalar_ *)&local_a0,true,false,5);
    local_d8.super__InputArray.sz.width = 0;
    local_d8.super__InputArray.sz.height = 0;
    local_d8.super__InputArray.flags = 0x1010000;
    local_d8.super__InputArray.obj = &blob;
    std::__cxx11::string::string((string *)&local_a0,"",&local_d9);
    cv::Scalar_<double>::Scalar_(&local_c0);
    cv::dnn::dnn4_v20211004::Net::setInput
              ((_InputArray *)net,(string *)&local_d8,1.0,(Scalar_ *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    cv::Mat::~Mat(&blob);
  }
  return;
}

Assistant:

void PreProcess(cv::Mat const& frame, cv::dnn::Net& net, cv::Size const& inpSize) noexcept {
  if (inpSize.width <= 0 || inpSize.height <= 0) {
    std::cerr << "Incorrect input dimensions.  Exiting..." << std::endl;
    return;
  }

  //! Create a 4D blob from a frame.
  cv::Mat blob;
  cv::dnn::blobFromImage(frame, blob, 1. / 255., inpSize, cv::Scalar(), true, false);
  
  net.setInput(blob);
  return;
}